

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall
sznet::net::TcpConnection::shrinkRSBuffer(TcpConnection *this,size_t sendSize,size_t recvSize)

{
  EventLoop *this_00;
  _Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_unsigned_long,_unsigned_long))(unsigned_long,_unsigned_long)>
  local_60;
  Functor local_38;
  
  this_00 = this->m_loop;
  local_60._M_f = (offset_in_TcpConnection_to_subr)shrinkRSBufferInLoop;
  local_60._8_8_ = 0;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::TcpConnection_*,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
  super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<2UL,_unsigned_long,_false>)(_Head_base<2UL,_unsigned_long,_false>)recvSize;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::TcpConnection_*,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = sendSize;
  local_60._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::TcpConnection_*,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_sznet::net::TcpConnection_*,_false>._M_head_impl = this;
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,unsigned_long,unsigned_long))(unsigned_long,unsigned_long)>,void>
            ((function<void()> *)&local_38,&local_60);
  EventLoop::runInLoop(this_00,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return;
}

Assistant:

void TcpConnection::shrinkRSBuffer(size_t sendSize, size_t recvSize)
{
	m_loop->runInLoop(std::bind(&TcpConnection::shrinkRSBufferInLoop, this, sendSize, recvSize));
}